

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O3

void tommy_hashdyn_foreach(tommy_hashdyn *hashdyn,tommy_foreach_func *func)

{
  uint uVar1;
  long lVar2;
  tommy_hashdyn_node **pptVar3;
  tommy_node_struct *ptVar4;
  tommy_hashdyn_node *ptVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = hashdyn->bucket_max;
  if ((ulong)uVar1 != 0) {
    pptVar3 = hashdyn->bucket;
    uVar6 = 0;
    do {
      ptVar5 = pptVar3[uVar6];
      while (ptVar5 != (tommy_hashdyn_node *)0x0) {
        ptVar4 = ptVar5->next;
        (*func)(ptVar5->data);
        ptVar5 = ptVar4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_hashdyn_foreach(tommy_hashdyn* hashdyn, tommy_foreach_func* func)
{
	tommy_count_t bucket_max = hashdyn->bucket_max;
	tommy_hashdyn_node** bucket = hashdyn->bucket;
	tommy_count_t pos;

	for (pos = 0; pos < bucket_max; ++pos) {
		tommy_hashdyn_node* node = bucket[pos];

		while (node) {
			void* data = node->data;
			node = node->next;
			func(data);
		}
	}
}